

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_handle_archipelago.hpp
# Opt level: O1

void PatchHandleArchipelago::add_proc_handle_archipelago_items_on_ground(ROM *rom)

{
  _func_int **pp_Var1;
  uint32_t uVar2;
  Code *pCVar3;
  initializer_list<unsigned_char> __l;
  initializer_list<md::DataRegister> __l_00;
  initializer_list<md::AddressRegister> __l_01;
  initializer_list<md::DataRegister> __l_02;
  initializer_list<md::AddressRegister> __l_03;
  Code proc;
  allocator_type local_17a;
  allocator_type local_179;
  vector<md::DataRegister,_std::allocator<md::DataRegister>_> local_178;
  vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> local_160;
  undefined1 local_148 [24];
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Stack_130;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  _Stack_100;
  Code local_c8;
  AddressRegister local_50;
  AddressRegister local_40;
  
  local_c8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_c8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header;
  local_c8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_c8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  local_c8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_c8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_c8._labels._M_t._M_impl.super__Rb_tree_header._M_header;
  local_c8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_c8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_c8._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_178.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)local_178.
                        super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>.
                        _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  local_178.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00261bb0;
  local_148._0_8_ = &PTR_getXn_00261c98;
  local_148._8_8_ = (pointer)0x7f;
  local_c8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_c8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_c8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_c8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  md::Code::cmpi(&local_c8,(ImmediateValue *)local_148,(Param *)&local_178,BYTE);
  local_148._0_8_ = local_148 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"not_archipelago","");
  md::Code::bne(&local_c8,(string *)local_148);
  if ((undefined1 *)local_148._0_8_ != local_148 + 0x10) {
    operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
  }
  local_178.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT62(local_178.
                         super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>.
                         _M_impl.super__Vector_impl_data._M_start._2_6_,0x500);
  __l._M_len = 2;
  __l._M_array = (iterator)&local_178;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_148,__l,
             (allocator_type *)&local_160);
  md::Code::trap(&local_c8,'\0',(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_148);
  if ((_func_int **)local_148._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_148._0_8_,local_148._16_8_ - local_148._0_8_);
  }
  local_148[8] = 7;
  local_148._0_8_ = &PTR_getXn_00261bb0;
  md::Code::clr(&local_c8,(Param *)local_148,WORD);
  local_148._0_8_ = &PTR_getXn_00261d18;
  local_148[0x10] = 5;
  local_148._8_8_ = &PTR_getXn_00261c50;
  _Stack_130._M_impl._0_3_ = 0x2003a;
  local_178.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)CONCAT71(local_178.
                         super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>.
                         _M_impl.super__Vector_impl_data._M_finish._1_7_,7);
  local_178.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00261bb0;
  md::Code::move(&local_c8,(Param *)local_148,(Param *)&local_178,BYTE);
  local_148[8] = '\a';
  local_148._0_8_ = &PTR_getXn_00261bb0;
  md::Code::lsx(&local_c8,'\x02',(DataRegister *)local_148,false,BYTE);
  local_148._8_8_ = (ulong)(uint7)local_148._9_7_ << 8;
  local_148._0_8_ = &PTR_getXn_00261bb0;
  _Stack_130._M_impl._0_1_ = 7;
  local_148._16_8_ = &PTR_getXn_00261bb0;
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)local_148;
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::vector
            (&local_178,__l_00,&local_179);
  local_40.super_Register._code = '\0';
  local_40.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00261c50;
  __l_01._M_len = 1;
  __l_01._M_array = &local_40;
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::vector
            (&local_160,__l_01,&local_17a);
  local_50.super_Register._code = '\a';
  local_50.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00261c50;
  md::Code::movem(&local_c8,&local_178,&local_160,true,&local_50,LONG);
  if (local_160.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_160.
                    super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_160.
                          super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_160.
                          super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_178.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_178.
                    super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_178.
                          super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_178.
                          super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_148[8] = 7;
  local_148._0_8_ = &PTR_getXn_00261bb0;
  local_178.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)local_178.
                        super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>.
                        _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  local_178.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00261bb0;
  md::Code::move(&local_c8,(Param *)local_148,(Param *)&local_178,LONG);
  local_178.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 7;
  local_178.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00261bb0;
  local_148._0_8_ = &PTR_getXn_00261c98;
  local_148._8_8_ = (pointer)0x7;
  md::Code::andi(&local_c8,(ImmediateValue *)local_148,(Param *)&local_178,BYTE);
  local_148._8_8_ = local_148._8_8_ & 0xffffffffffffff00;
  local_148._0_8_ = &PTR_getXn_00261bb0;
  md::Code::lsx(&local_c8,'\x03',(DataRegister *)local_148,false,BYTE);
  local_178.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  local_178.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00261c50;
  local_148._0_8_ = &PTR_getXn_00261cd8;
  local_148._8_8_ = (pointer)0x200ff1060;
  md::Code::lea(&local_c8,(Param *)local_148,(AddressRegister *)&local_178);
  local_178.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)CONCAT71(local_178.
                         super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>.
                         _M_impl.super__Vector_impl_data._M_finish._1_7_,7);
  local_178.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00261bb0;
  local_160.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  local_160.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00261c50;
  local_50.super_Register._code = '\0';
  local_50.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00261bb0;
  local_148._0_8_ = &PTR_getXn_00261d58;
  _Stack_130._M_impl._0_5_ = 2;
  local_148._8_8_ = &local_160;
  local_148._16_8_ = &local_50;
  md::Code::bset(&local_c8,(DataRegister *)&local_178,(Param *)local_148);
  local_148._8_8_ = local_148._8_8_ & 0xffffffffffffff00;
  local_148._0_8_ = &PTR_getXn_00261bb0;
  _Stack_130._M_impl._0_1_ = 7;
  local_148._16_8_ = &PTR_getXn_00261bb0;
  __l_02._M_len = 2;
  __l_02._M_array = (iterator)local_148;
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::vector
            (&local_178,__l_02,&local_179);
  pp_Var1 = (_func_int **)(local_148 + 0x10);
  local_40.super_Register._code = '\0';
  local_40.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00261c50;
  __l_03._M_len = 1;
  __l_03._M_array = &local_40;
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::vector
            (&local_160,__l_03,&local_17a);
  local_50.super_Register._code = '\a';
  local_50.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00261c50;
  md::Code::movem(&local_c8,&local_178,&local_160,false,&local_50,LONG);
  if (local_160.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_160.
                    super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_160.
                          super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_160.
                          super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_178.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_178.
                    super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_178.
                          super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_178.
                          super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_178.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)CONCAT71(local_178.
                         super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>.
                         _M_impl.super__Vector_impl_data._M_finish._1_7_,7);
  local_178.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00261bb0;
  local_148._0_8_ = &PTR_getXn_00261c98;
  local_148._8_8_ = (pointer)0x100000200;
  md::Code::addi(&local_c8,(ImmediateValue *)local_148,(Param *)&local_178,WORD);
  local_148[8] = 7;
  local_148._0_8_ = &PTR_getXn_00261bb0;
  local_178.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00261cd8;
  local_178.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x200ff0026;
  md::Code::move(&local_c8,(Param *)local_148,(Param *)&local_178,WORD);
  local_178.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)local_178.
                        super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>.
                        _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  local_178.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00261bb0;
  local_148._0_8_ = &PTR_getXn_00261c98;
  local_148._8_8_ = (pointer)0x10000001e;
  md::Code::move(&local_c8,(Param *)local_148,(Param *)&local_178,WORD);
  local_148._0_8_ = &PTR_getXn_00261cd8;
  local_148._8_8_ = (pointer)0x200028fd8;
  md::Code::jsr(&local_c8,(Param *)local_148);
  local_148._0_8_ = &PTR_getXn_00261cd8;
  local_148._8_8_ = (pointer)0x200024b30;
  md::Code::jmp(&local_c8,(Param *)local_148);
  local_148._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"not_archipelago","");
  md::Code::label(&local_c8,(string *)local_148);
  if ((_func_int **)local_148._0_8_ != pp_Var1) {
    operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
  }
  local_148._0_8_ = &PTR_getXn_00261cd8;
  local_148._8_8_ = (pointer)0x200029232;
  md::Code::jsr(&local_c8,(Param *)local_148);
  local_148._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"jmp_to_24AF4","");
  md::Code::bne(&local_c8,(string *)local_148);
  if ((_func_int **)local_148._0_8_ != pp_Var1) {
    operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
  }
  local_148._0_8_ = &PTR_getXn_00261cd8;
  local_148._8_8_ = (pointer)0x200024aea;
  md::Code::jmp(&local_c8,(Param *)local_148);
  local_148._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"jmp_to_24AF4","");
  md::Code::label(&local_c8,(string *)local_148);
  if ((_func_int **)local_148._0_8_ != pp_Var1) {
    operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
  }
  local_148._0_8_ = &PTR_getXn_00261cd8;
  local_148._8_8_ = (pointer)0x200024af4;
  md::Code::jmp(&local_c8,(Param *)local_148);
  local_148._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"");
  uVar2 = md::ROM::inject_code(rom,&local_c8,(string *)local_148);
  if ((_func_int **)local_148._0_8_ != pp_Var1) {
    operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
  }
  _Stack_130._M_impl.super__Rb_tree_header._M_header._M_left =
       &_Stack_130._M_impl.super__Rb_tree_header._M_header;
  _Stack_100._M_impl._0_8_ = 0;
  _Stack_130._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  _Stack_130._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  _Stack_130._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_148._16_8_ = 0;
  _Stack_130._M_impl._0_8_ = 0;
  local_148._0_8_ = (_func_int **)0x0;
  local_148._8_8_ = (pointer)0x0;
  _Stack_100._M_impl.super__Rb_tree_header._M_node_count = 0;
  _Stack_100._M_impl.super__Rb_tree_header._M_header._M_left =
       &_Stack_100._M_impl.super__Rb_tree_header._M_header;
  _Stack_130._M_impl.super__Rb_tree_header._M_node_count = 0;
  _Stack_100._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  _Stack_100._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  _Stack_100._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_178.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00261cd8;
  local_178.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)CONCAT44(2,uVar2);
  _Stack_130._M_impl.super__Rb_tree_header._M_header._M_right =
       _Stack_130._M_impl.super__Rb_tree_header._M_header._M_left;
  _Stack_100._M_impl.super__Rb_tree_header._M_header._M_right =
       _Stack_100._M_impl.super__Rb_tree_header._M_header._M_left;
  pCVar3 = md::Code::jmp((Code *)local_148,(Param *)&local_178);
  pCVar3 = md::Code::nop(pCVar3,1);
  md::ROM::set_code(rom,0x24ae4,pCVar3);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&_Stack_100);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&_Stack_130);
  if ((_func_int **)local_148._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_148._0_8_,local_148._16_8_ - local_148._0_8_);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&local_c8._labels._M_t);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_c8._pending_branches._M_t);
  if (local_c8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8._bytes.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c8._bytes.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8._bytes.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

static void add_proc_handle_archipelago_items_on_ground(md::ROM& rom)
    {
        md::Code proc;
        {
            proc.cmpib(ITEM_ARCHIPELAGO, reg_D0);
            proc.bne("not_archipelago");
            {
                proc.trap(0x00, { 0x00, 0x05 });  // Play "get item" jingle

                // Update current ground item UUID
                proc.clrw(reg_D7);
                proc.moveb(addr_(reg_A5, 0x3A), reg_D7);  // Ground ID stored as dialogue
                proc.lsrb(2, reg_D7);                     //   / 4

                // Set the ground check flag manually since we skip the "GetItem" function
                proc.movem_to_stack({ reg_D0, reg_D7 }, { reg_A0 });
                proc.movel(reg_D7, reg_D0);
                proc.andib(0x07, reg_D7);      // D7 contains flag bit
                proc.lsrb(3, reg_D0);          // D0 contains flag byte
                proc.lea(0xFF1060, reg_A0);
                proc.bset(reg_D7, addr_(reg_A0, reg_D0));
                proc.movem_from_stack({ reg_D0, reg_D7 }, { reg_A0 });

                proc.addiw(0x200, reg_D7);                // add 0x200 to ground_item_id to get UUID
                proc.movew(reg_D7, addr_(ADDR_ARCHIPELAGO_CURRENT_LOCATION_UUID));

                proc.movew(0x1E, reg_D0); // "Sent {ITEM}"
                proc.jsr(0x28FD8);        // DisplayText
                proc.jmp(0x24B30);        // Return to normal flow not giving any item
            }
            proc.label("not_archipelago");
            // Item is regular, perform the checks as usual
            proc.jsr(0x29232); // GetRemainingItemAllowedCount
            proc.bne("jmp_to_24AF4");
            proc.jmp(0x24AEA);
            proc.label("jmp_to_24AF4");
            proc.jmp(0x24AF4);
        }

        uint32_t addr = rom.inject_code(proc);
        rom.set_code(0x24AE4, md::Code().jmp(addr).nop());
    }